

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jacobi.h
# Opt level: O2

void __thiscall
Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::applyOnTheRight<double>
          (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this,Index p,Index q,
          JacobiRotation<double> *j)

{
  ColXpr y;
  ColXpr x;
  JacobiRotation<double> local_88;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_78;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_50;
  
  Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
            (&local_50,(Matrix<double,__1,__1,_0,__1,__1> *)this,p);
  Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
            (&local_78,(Matrix<double,__1,__1,_0,__1,__1> *)this,q);
  local_88.m_s = -j->m_s;
  local_88.m_c = j->m_c;
  internal::
  apply_rotation_in_the_plane<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,double>
            (&local_50,&local_78,&local_88);
  return;
}

Assistant:

inline void MatrixBase<Derived>::applyOnTheRight(Index p, Index q, const JacobiRotation<OtherScalar>& j)
{
  ColXpr x(this->col(p));
  ColXpr y(this->col(q));
  internal::apply_rotation_in_the_plane(x, y, j.transpose());
}